

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O1

RunElement * __thiscall
duckdb::
MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
::StartGames(RunElement *__return_storage_ptr__,
            MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
            *this,Games *losers,RunElements *elements,RunElement *sentinel)

{
  ulong *puVar1;
  ulong uVar2;
  pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *ppVar3;
  bool bVar4;
  pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *ppVar5;
  long lVar6;
  pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *ppVar7;
  long lVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *ppVar12;
  ulong *puVar13;
  long lVar14;
  Games winners;
  ulong auStack_328 [2];
  unsigned_long local_318;
  _Head_base<0UL,_unsigned_long,_false> _Stack_310;
  unsigned_long local_308;
  ulong auStack_300 [42];
  unsigned_long auStack_1b0 [48];
  
  lVar14 = 0;
  auStack_328[1] = 0xcf6fcf;
  switchD_00570541::default(auStack_328 + 2,0,0x2e8);
  lVar6 = 0;
  ppVar5 = elements->_M_elems;
  do {
    ppVar12 = elements->_M_elems + lVar6 * 2 + 1;
    uVar2 = *(ulong *)((long)&elements->_M_elems[0].first.
                              super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                              super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + lVar14 * 2)
    ;
    uVar10 = *(ulong *)((long)&elements->_M_elems[1].first.
                               super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                               super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + lVar14 * 2
                       );
    ppVar7 = ppVar5;
    ppVar3 = ppVar5;
    if ((uVar10 <= uVar2) &&
       ((uVar10 < uVar2 ||
        (*(ulong *)((long)&elements->_M_elems[1].first.
                           super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                           super__Tuple_impl<1UL,_unsigned_long>.
                           super__Head_base<1UL,_unsigned_long,_false>._M_head_impl + lVar14 * 2) <=
         *(ulong *)((long)&elements->_M_elems[0].first.
                           super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                           super__Tuple_impl<1UL,_unsigned_long>.
                           super__Head_base<1UL,_unsigned_long,_false>._M_head_impl + lVar14 * 2))))
       ) {
      bVar4 = *(ulong *)((long)&elements->_M_elems[1].first.
                                super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                                super__Tuple_impl<1UL,_unsigned_long>.
                                super__Head_base<1UL,_unsigned_long,_false>._M_head_impl +
                        lVar14 * 2) <
              *(ulong *)((long)&elements->_M_elems[0].first.
                                super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                                super__Tuple_impl<1UL,_unsigned_long>.
                                super__Head_base<1UL,_unsigned_long,_false>._M_head_impl +
                        lVar14 * 2);
      if (uVar2 != uVar10) {
        bVar4 = uVar10 < uVar2;
      }
      if ((bVar4) ||
         (*(ulong *)((long)&elements->_M_elems[1].second + lVar14 * 2) <=
          *(ulong *)((long)&elements->_M_elems[0].second + lVar14 * 2))) {
        ppVar7 = ppVar12;
        uVar10 = uVar2;
        ppVar12 = ppVar5;
        ppVar3 = elements->_M_elems + lVar6 * 2 + 1;
      }
    }
    *(ulong *)((long)&losers->_M_elems[0xf].first.
                      super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + lVar14) = uVar10;
    *(unsigned_long *)
     ((long)&losers->_M_elems[0xf].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
             _M_head_impl + lVar14) =
         (((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&ppVar12->first)->first)
         .super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>
         .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
    *(unsigned_long *)((long)&losers->_M_elems[0xf].second + lVar14) = ppVar12->second;
    *(unsigned_long *)((long)auStack_1b0 + lVar14 + 8) =
         (((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&ppVar3->first)->first).
         super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
         super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    *(unsigned_long *)((long)auStack_1b0 + lVar14) =
         (((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&ppVar7->first)->first).
         super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
         super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
    *(unsigned_long *)((long)auStack_1b0 + lVar14 + 0x10) = ppVar7->second;
    lVar6 = lVar6 + 1;
    lVar14 = lVar14 + 0x18;
    ppVar5 = ppVar5 + 2;
  } while (lVar14 != 0x180);
  lVar6 = 0xe;
  lVar14 = 0xb0;
  lVar8 = 0x2b8;
  do {
    puVar1 = (ulong *)((long)auStack_328 + lVar8 + 0x10);
    puVar13 = auStack_300 + lVar6 * 6 + 3;
    uVar2 = *(ulong *)((long)&_Stack_310._M_head_impl + lVar8);
    uVar10 = *(ulong *)((long)auStack_300 + lVar8 + 8);
    puVar9 = puVar1;
    uVar11 = uVar2;
    if ((uVar10 <= uVar2) &&
       ((uVar10 < uVar2 || (*(ulong *)((long)auStack_300 + lVar8) <= *puVar1)))) {
      bVar4 = *(ulong *)((long)auStack_300 + lVar8) < *puVar1;
      if (uVar2 != uVar10) {
        bVar4 = uVar10 < uVar2;
      }
      if ((bVar4) ||
         (*(ulong *)((long)auStack_300 + lVar8 + 0x10) <= *(ulong *)((long)auStack_300 + lVar8 + -8)
         )) {
        puVar9 = puVar13;
        uVar11 = uVar10;
        uVar10 = uVar2;
        puVar13 = puVar1;
      }
    }
    *(ulong *)((long)losers->_M_elems + lVar14 * 2 + -8) = uVar10;
    *(ulong *)((long)losers->_M_elems + lVar14 * 2 + -0x10) = *puVar13;
    *(ulong *)((long)&losers->_M_elems[0].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>
                      .super__Tuple_impl<1UL,_unsigned_long>.
                      super__Head_base<1UL,_unsigned_long,_false>._M_head_impl + lVar14 * 2) =
         puVar13[2];
    *(ulong *)((long)auStack_328 + lVar14 * 2 + 8) = uVar11;
    *(ulong *)((long)auStack_328 + lVar14 * 2) = *puVar9;
    *(ulong *)((long)auStack_328 + lVar14 * 2 + 0x10) = puVar9[2];
    lVar6 = lVar6 + -1;
    lVar14 = lVar14 + -0xc;
    lVar8 = lVar8 + -0x30;
  } while (lVar8 != -0x18);
  __return_storage_ptr__->second = local_308;
  (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       local_318;
  (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = _Stack_310._M_head_impl;
  return __return_storage_ptr__;
}

Assistant:

RunElement StartGames(Games &losers, const RunElements &elements, const RunElement &sentinel) {
		const auto elem_nodes = elements.size();
		const auto game_nodes = losers.size();
		Games winners;

		//	Play the first round of games,
		//	placing the losers at the bottom of the game
		const auto base_offset = game_nodes / 2;
		auto losers_base = losers.data() + base_offset;
		auto winners_base = winners.data() + base_offset;

		const auto base_count = elem_nodes / 2;
		for (idx_t i = 0; i < base_count; ++i) {
			const auto &e0 = elements[i * 2 + 0];
			const auto &e1 = elements[i * 2 + 1];
			if (cmp(e0, e1)) {
				losers_base[i] = e1;
				winners_base[i] = e0;
			} else {
				losers_base[i] = e0;
				winners_base[i] = e1;
			}
		}

		//	Fill in any byes
		if (elem_nodes % 2) {
			winners_base[base_count] = elements.back();
			losers_base[base_count] = sentinel;
		}

		//	Pad to a power of 2
		const auto base_size = (game_nodes + 1) / 2;
		for (idx_t i = (elem_nodes + 1) / 2; i < base_size; ++i) {
			winners_base[i] = sentinel;
			losers_base[i] = sentinel;
		}

		//	Play the winners against each other
		//	and stick the losers in the upper levels of the tournament tree
		for (idx_t i = base_offset; i-- > 0;) {
			//	Indexing backwards
			const auto &e0 = winners[i * 2 + 1];
			const auto &e1 = winners[i * 2 + 2];
			if (cmp(e0, e1)) {
				losers[i] = e1;
				winners[i] = e0;
			} else {
				losers[i] = e0;
				winners[i] = e1;
			}
		}

		//	Return the final winner
		return winners[0];
	}